

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskImageImplementation.hpp
# Opt level: O0

void __thiscall
Storage::Disk::DiskImageHolder<Storage::Disk::WOZ>::flush_tracks
          (DiskImageHolder<Storage::Disk::WOZ> *this)

{
  key_type *__x;
  bool bVar1;
  int iVar2;
  map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
  *this_00;
  set<Storage::Disk::Track::Address,_std::less<Storage::Disk::Track::Address>,_std::allocator<Storage::Disk::Track::Address>_>
  *this_01;
  map<Storage::Disk::Track::Address,std::shared_ptr<Storage::Disk::Track>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,std::shared_ptr<Storage::Disk::Track>>>>
  *this_02;
  __shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_03;
  element_type *peVar3;
  undefined4 extraout_var;
  pointer this_04;
  __enable_if_t<is_constructible<value_type,_pair<Address,_shared_ptr<Track>_>_>::value,_pair<iterator,_bool>_>
  _Var4;
  anon_class_24_2_4497ab02 local_c8;
  function<void_()> local_b0;
  _Base_ptr local_90;
  undefined1 local_88;
  shared_ptr<Storage::Disk::Track> local_70;
  pair<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_> local_60;
  key_type *local_48;
  Address *address;
  iterator __end0;
  iterator __begin0;
  set<Storage::Disk::Track::Address,_std::less<Storage::Disk::Track::Address>,_std::allocator<Storage::Disk::Track::Address>_>
  *__range3;
  shared_ptr<std::map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>_>
  track_copies;
  DiskImageHolder<Storage::Disk::WOZ> *this_local;
  
  bVar1 = std::
          set<Storage::Disk::Track::Address,_std::less<Storage::Disk::Track::Address>,_std::allocator<Storage::Disk::Track::Address>_>
          ::empty(&(this->super_DiskImageHolderBase).unwritten_tracks_);
  if (!bVar1) {
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr *)&(this->super_DiskImageHolderBase).update_queue_);
    if (!bVar1) {
      std::make_unique<Concurrency::AsyncTaskQueue<true,true,void>>();
      std::
      unique_ptr<Concurrency::AsyncTaskQueue<true,_true,_void>,_std::default_delete<Concurrency::AsyncTaskQueue<true,_true,_void>_>_>
      ::operator=(&(this->super_DiskImageHolderBase).update_queue_,
                  (unique_ptr<Concurrency::AsyncTaskQueue<true,_true,_void>,_std::default_delete<Concurrency::AsyncTaskQueue<true,_true,_void>_>_>
                   *)&track_copies.
                      super___shared_ptr<std::map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
      std::
      unique_ptr<Concurrency::AsyncTaskQueue<true,_true,_void>,_std::default_delete<Concurrency::AsyncTaskQueue<true,_true,_void>_>_>
      ::~unique_ptr((unique_ptr<Concurrency::AsyncTaskQueue<true,_true,_void>,_std::default_delete<Concurrency::AsyncTaskQueue<true,_true,_void>_>_>
                     *)&track_copies.
                        super___shared_ptr<std::map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
    }
    this_00 = (map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
               *)operator_new(0x30);
    std::
    map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
    ::map(this_00);
    std::
    shared_ptr<std::map<Storage::Disk::Track::Address,std::shared_ptr<Storage::Disk::Track>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,std::shared_ptr<Storage::Disk::Track>>>>>
    ::
    shared_ptr<std::map<Storage::Disk::Track::Address,std::shared_ptr<Storage::Disk::Track>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,std::shared_ptr<Storage::Disk::Track>>>>,void>
              ((shared_ptr<std::map<Storage::Disk::Track::Address,std::shared_ptr<Storage::Disk::Track>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,std::shared_ptr<Storage::Disk::Track>>>>>
                *)&__range3,this_00);
    this_01 = &(this->super_DiskImageHolderBase).unwritten_tracks_;
    __end0 = std::
             set<Storage::Disk::Track::Address,_std::less<Storage::Disk::Track::Address>,_std::allocator<Storage::Disk::Track::Address>_>
             ::begin(this_01);
    address = (Address *)
              std::
              set<Storage::Disk::Track::Address,_std::less<Storage::Disk::Track::Address>,_std::allocator<Storage::Disk::Track::Address>_>
              ::end(this_01);
    while( true ) {
      bVar1 = std::operator!=(&__end0,(_Self *)&address);
      if (!bVar1) break;
      local_48 = std::_Rb_tree_const_iterator<Storage::Disk::Track::Address>::operator*(&__end0);
      this_02 = (map<Storage::Disk::Track::Address,std::shared_ptr<Storage::Disk::Track>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,std::shared_ptr<Storage::Disk::Track>>>>
                 *)std::
                   __shared_ptr_access<std::map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<std::map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)&__range3);
      __x = local_48;
      this_03 = (__shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::
                   map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>
                   ::operator[](&(this->super_DiskImageHolderBase).cached_tracks_,local_48);
      peVar3 = std::
               __shared_ptr_access<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(this_03);
      iVar2 = (*peVar3->_vptr_Track[4])();
      std::shared_ptr<Storage::Disk::Track>::shared_ptr<Storage::Disk::Track,void>
                (&local_70,(Track *)CONCAT44(extraout_var,iVar2));
      std::make_pair<Storage::Disk::Track::Address_const&,std::shared_ptr<Storage::Disk::Track>>
                (&local_60,__x,&local_70);
      _Var4 = std::
              map<Storage::Disk::Track::Address,std::shared_ptr<Storage::Disk::Track>,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,std::shared_ptr<Storage::Disk::Track>>>>
              ::
              insert<std::pair<Storage::Disk::Track::Address,std::shared_ptr<Storage::Disk::Track>>>
                        (this_02,&local_60);
      local_90 = (_Base_ptr)_Var4.first._M_node;
      local_88 = _Var4.second;
      std::pair<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>::~pair
                (&local_60);
      std::shared_ptr<Storage::Disk::Track>::~shared_ptr(&local_70);
      std::_Rb_tree_const_iterator<Storage::Disk::Track::Address>::operator++(&__end0);
    }
    std::
    set<Storage::Disk::Track::Address,_std::less<Storage::Disk::Track::Address>,_std::allocator<Storage::Disk::Track::Address>_>
    ::clear(&(this->super_DiskImageHolderBase).unwritten_tracks_);
    this_04 = std::
              unique_ptr<Concurrency::AsyncTaskQueue<true,_true,_void>,_std::default_delete<Concurrency::AsyncTaskQueue<true,_true,_void>_>_>
              ::operator->(&(this->super_DiskImageHolderBase).update_queue_);
    local_c8.this = this;
    std::
    shared_ptr<std::map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>_>
    ::shared_ptr(&local_c8.track_copies,
                 (shared_ptr<std::map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>_>
                  *)&__range3);
    std::function<void()>::
    function<Storage::Disk::DiskImageHolder<Storage::Disk::WOZ>::flush_tracks()::_lambda()_1_,void>
              ((function<void()> *)&local_b0,&local_c8);
    Concurrency::AsyncTaskQueue<true,_true,_void>::enqueue(this_04,&local_b0);
    std::function<void_()>::~function(&local_b0);
    flush_tracks()::{lambda()#1}::~flush_tracks((_lambda___1_ *)&local_c8);
    std::
    shared_ptr<std::map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>_>
    ::~shared_ptr((shared_ptr<std::map<Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_std::shared_ptr<Storage::Disk::Track>_>_>_>_>
                   *)&__range3);
  }
  return;
}

Assistant:

void DiskImageHolder<T>::flush_tracks() {
	if(!unwritten_tracks_.empty()) {
		if(!update_queue_) update_queue_ = std::make_unique<Concurrency::AsyncTaskQueue<true>>();

		using TrackMap = std::map<Track::Address, std::shared_ptr<Track>>;
		std::shared_ptr<TrackMap> track_copies(new TrackMap);
		for(const auto &address : unwritten_tracks_) {
			track_copies->insert(std::make_pair(address, std::shared_ptr<Track>(cached_tracks_[address]->clone())));
		}
		unwritten_tracks_.clear();

		update_queue_->enqueue([this, track_copies]() {
			disk_image_.set_tracks(*track_copies);
		});
	}
}